

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

float __thiscall trackerboy::Module::framerate(Module *this)

{
  if (this->mSystem == dmg) {
    return 59.7;
  }
  if (this->mSystem == sgb) {
    return 61.1;
  }
  return (float)this->mCustomFramerate;
}

Assistant:

float Module::framerate() const noexcept {
    switch (mSystem) {
        case System::dmg:
            return GB_FRAMERATE_DMG;
        case System::sgb:
            return GB_FRAMERATE_SGB;
        default:
            return (float)mCustomFramerate;
    }
}